

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O0

TCGTemp * tcg_global_alloc(TCGContext_conflict9 *s)

{
  TCGTemp *pTVar1;
  TCGTemp *ts;
  TCGContext_conflict9 *s_local;
  
  s->nb_globals = s->nb_globals + 1;
  pTVar1 = tcg_temp_alloc(s);
  *(ulong *)pTVar1 = *(ulong *)pTVar1 & 0xffffffdfffffffff | 0x2000000000;
  return pTVar1;
}

Assistant:

static inline TCGTemp *tcg_global_alloc(TCGContext *s)
{
    TCGTemp *ts;

    tcg_debug_assert(s->nb_globals == s->nb_temps);
    s->nb_globals++;
    ts = tcg_temp_alloc(s);
    ts->temp_global = 1;

    return ts;
}